

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderCopyNode
               (ImGuiID src_node_id,ImGuiID dst_node_id,ImVector<unsigned_int> *out_node_remap_pairs
               )

{
  ImGuiContext_conflict *ctx_00;
  ImGuiDockNode *src_node_00;
  ImGuiDockNode *src_node;
  ImGuiContext_conflict *ctx;
  ImVector<unsigned_int> *out_node_remap_pairs_local;
  ImGuiID dst_node_id_local;
  ImGuiID src_node_id_local;
  
  ctx_00 = GImGui;
  if (src_node_id == 0) {
    __assert_fail("src_node_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d88,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (dst_node_id == 0) {
    __assert_fail("dst_node_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d89,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (out_node_remap_pairs == (ImVector<unsigned_int> *)0x0) {
    __assert_fail("out_node_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d8a,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  DockBuilderRemoveNode(dst_node_id);
  src_node_00 = DockContextFindNodeByID(ctx_00,src_node_id);
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    ImVector<unsigned_int>::clear(out_node_remap_pairs);
    DockBuilderCopyNodeRec(src_node_00,dst_node_id,out_node_remap_pairs);
    if (out_node_remap_pairs->Size % 2 == 0) {
      return;
    }
    __assert_fail("(out_node_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d94,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  __assert_fail("src_node != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3d8f,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
}

Assistant:

void ImGui::DockBuilderCopyNode(ImGuiID src_node_id, ImGuiID dst_node_id, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(src_node_id != 0);
    IM_ASSERT(dst_node_id != 0);
    IM_ASSERT(out_node_remap_pairs != NULL);

    DockBuilderRemoveNode(dst_node_id);

    ImGuiDockNode* src_node = DockContextFindNodeByID(ctx, src_node_id);
    IM_ASSERT(src_node != NULL);

    out_node_remap_pairs->clear();
    DockBuilderCopyNodeRec(src_node, dst_node_id, out_node_remap_pairs);

    IM_ASSERT((out_node_remap_pairs->Size % 2) == 0);
}